

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserexternalvariable.cpp
# Opt level: O2

VariablePtr __thiscall
libcellml::AnalyserExternalVariable::dependency
          (AnalyserExternalVariable *this,ModelPtr *model,string *componentName,string *variableName
          )

{
  iterator iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  string *in_R8;
  VariablePtr VVar3;
  
  iVar1 = AnalyserExternalVariableImpl::findDependency
                    ((AnalyserExternalVariableImpl *)
                     (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,(ModelPtr *)componentName,variableName,in_R8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iVar1._M_current ==
      (((model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      super_enable_shared_from_this<libcellml::Model>)._M_weak_this.
      super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    this->mPimpl = (AnalyserExternalVariableImpl *)0x0;
    this[1].mPimpl = (AnalyserExternalVariableImpl *)0x0;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    std::__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *)this,
               &(iVar1._M_current)->
                super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>);
    _Var2._M_pi = extraout_RDX_00;
  }
  VVar3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  VVar3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (VariablePtr)VVar3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VariablePtr AnalyserExternalVariable::dependency(const ModelPtr &model,
                                                 const std::string &componentName,
                                                 const std::string &variableName) const
{
    auto result = mPimpl->findDependency(model, componentName, variableName);

    return (result != mPimpl->mDependencies.end()) ?
               *result :
               nullptr;
}